

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

void __thiscall
dg::vr::GraphBuilder::buildBranch(GraphBuilder *this,BranchInst *inst,VRLocation *last)

{
  undefined8 uVar1;
  mapped_type pVVar2;
  mapped_type pVVar3;
  mapped_type *ppVVar4;
  sockaddr *psVar5;
  VRLocation *pVVar6;
  VRLocation *this_00;
  socklen_t __len;
  int __fd;
  key_type local_40;
  VRLocation *local_38;
  
  if ((*(uint *)(inst + 0x14) & 0x7ffffff) == 1) {
    local_40 = *(key_type *)(inst + -0x20);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)(this + 0x10),&local_40);
    __fd = (int)*ppVVar4;
    psVar5 = (sockaddr *)operator_new(0x10);
    psVar5->sa_data[6] = '\0';
    psVar5->sa_data[7] = '\0';
    psVar5->sa_data[8] = '\0';
    psVar5->sa_data[9] = '\0';
    __len = 0x136cc0;
    *(undefined ***)psVar5 = &PTR__VROp_00136cc0;
    this_00 = last;
  }
  else {
    pVVar6 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(this + 8));
    local_38 = pVVar6;
    this_00 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(this + 8));
    uVar1 = *(undefined8 *)(inst + -0x60);
    psVar5 = (sockaddr *)operator_new(0x20);
    psVar5->sa_data[6] = '\x02';
    psVar5->sa_data[7] = '\0';
    psVar5->sa_data[8] = '\0';
    psVar5->sa_data[9] = '\0';
    psVar5[1].sa_family = (short)uVar1;
    psVar5[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
    psVar5[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
    psVar5[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
    psVar5[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
    psVar5[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
    psVar5[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
    *(undefined ***)psVar5 = &PTR__VROp_00136d00;
    psVar5[1].sa_data[6] = '\x01';
    VRLocation::connect(last,(int)pVVar6,psVar5,2);
    psVar5 = (sockaddr *)operator_new(0x20);
    __len = 2;
    psVar5->sa_data[6] = '\x02';
    psVar5->sa_data[7] = '\0';
    psVar5->sa_data[8] = '\0';
    psVar5->sa_data[9] = '\0';
    psVar5[1].sa_family = (short)uVar1;
    psVar5[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
    psVar5[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
    psVar5[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
    psVar5[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
    psVar5[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
    psVar5[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
    *(undefined ***)psVar5 = &PTR__VROp_00136d00;
    psVar5[1].sa_data[6] = '\0';
    VRLocation::connect(last,(int)this_00,psVar5,2);
    local_40 = *(key_type *)(inst + -0x20);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)(this + 0x10),&local_40);
    pVVar2 = *ppVVar4;
    local_40 = *(key_type *)(inst + -0x40);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)(this + 0x10),&local_40);
    pVVar3 = *ppVVar4;
    psVar5 = (sockaddr *)operator_new(0x10);
    psVar5->sa_data[6] = '\0';
    psVar5->sa_data[7] = '\0';
    psVar5->sa_data[8] = '\0';
    psVar5->sa_data[9] = '\0';
    *(undefined ***)psVar5 = &PTR__VROp_00136cc0;
    VRLocation::connect(local_38,(int)pVVar2,psVar5,__len);
    psVar5 = (sockaddr *)operator_new(0x10);
    psVar5->sa_data[6] = '\0';
    psVar5->sa_data[7] = '\0';
    psVar5->sa_data[8] = '\0';
    psVar5->sa_data[9] = '\0';
    *(undefined ***)psVar5 = &PTR__VROp_00136cc0;
    __fd = (int)pVVar3;
  }
  VRLocation::connect(this_00,__fd,psVar5,__len);
  return;
}

Assistant:

void GraphBuilder::buildBranch(const llvm::BranchInst *inst, VRLocation &last) {
    if (inst->isUnconditional()) {
        assert(fronts.find(inst->getSuccessor(0)) != fronts.end());
        VRLocation &first = *fronts[inst->getSuccessor(0)];

        last.connect(first, new VRNoop());
    } else {
        VRLocation &truePadding = codeGraph.newVRLocation();
        VRLocation &falsePadding = codeGraph.newVRLocation();

        auto *condition = inst->getCondition();
        last.connect(truePadding, new VRAssumeBool(condition, true));
        last.connect(falsePadding, new VRAssumeBool(condition, false));

        assert(fronts.find(inst->getSuccessor(0)) != fronts.end());
        assert(fronts.find(inst->getSuccessor(1)) != fronts.end());

        VRLocation &firstTrue = *fronts[inst->getSuccessor(0)];
        VRLocation &firstFalse = *fronts[inst->getSuccessor(1)];

        truePadding.connect(firstTrue, new VRNoop());
        falsePadding.connect(firstFalse, new VRNoop());
    }
}